

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cComputeShaderTests.cpp
# Opt level: O2

long __thiscall gl4cts::anon_unknown_0::AdvancedDynamicPaths::Run(AdvancedDynamicPaths *this)

{
  CallLogWrapper *this_00;
  GLuint *buffers;
  bool bVar1;
  GLuint GVar2;
  GLint GVar3;
  bool *compile_error;
  Vector<float,_4> *this_01;
  long lVar4;
  pointer *this_02;
  ulong uVar5;
  allocator_type local_e9;
  Vector<float,_4> local_e8;
  Vector<float,_4> local_d8;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> data;
  Vector<float,_4> local_a8;
  Vector<float,_4> local_98;
  GLuint *local_80;
  vec4 expected [4];
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&data,
             "\nlayout(local_size_x = 4) in;\nlayout(std140, binding = 0) buffer Output {\n  vec4 g_output[4];\n};\nuniform isamplerBuffer g_path_buffer;\nuniform vec4[4] g_input0 = vec4[4](vec4(100), vec4(200), vec4(300), vec4(400));\nuniform samplerBuffer g_input1;\nlayout(binding = 1, std430) buffer Input2 {\n  vec4[4] g_input2;\n};\n\nvoid Path2(int id) {\n  g_output[id] = texelFetch(g_input1, int(gl_LocalInvocationIndex));\n}\nvoid main() {\n  const int id = int(gl_GlobalInvocationID.x);\n  const int path = texelFetch(g_path_buffer, id).x;\n\n  if (path == 0) {\n    g_output[id] = g_input0[gl_LocalInvocationID.x];\n    memoryBarrier();\n  } else if (path == 1) {\n    return;\n  } else if (path == 2) {\n    Path2(id);\n    return;\n  } else if (path == 3) {\n    g_output[id] = g_input2[path - 1];\n    memoryBarrierBuffer();\n  }\n}"
             ,(allocator<char> *)expected);
  GVar2 = ComputeShaderBase::CreateComputeProgram(&this->super_ComputeShaderBase,(string *)&data);
  this->m_program = GVar2;
  std::__cxx11::string::~string((string *)&data);
  this_00 = &(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glLinkProgram(this_00,this->m_program);
  bVar1 = ComputeShaderBase::CheckProgram
                    (&this->super_ComputeShaderBase,this->m_program,compile_error);
  if (bVar1) {
    buffers = this->m_buffer;
    glu::CallLogWrapper::glGenBuffers(this_00,4,buffers);
    glu::CallLogWrapper::glGenTextures(this_00,2,this->m_texture);
    this_01 = expected;
    tcu::Vector<float,_4>::Vector(this_01,-100.0);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
              (&data,4,this_01,&local_e9);
    local_80 = buffers;
    glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,0,*buffers);
    glu::CallLogWrapper::glBufferData
              (this_00,0x90d2,
               (long)data.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)data.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
               data.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start,0x88ea);
    std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~_Vector_base
              (&data.
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>);
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&data,1.0);
    tcu::Vector<float,_4>::Vector
              ((Vector<float,_4> *)
               &data.
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,2.0);
    tcu::Vector<float,_4>::Vector(&local_a8,3.0);
    tcu::Vector<float,_4>::Vector(&local_98,4.0);
    glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,1,this->m_buffer[1]);
    glu::CallLogWrapper::glBufferData(this_00,0x90d2,0x40,&data,0x88ea);
    data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x200000003;
    data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)&DAT_00000001;
    glu::CallLogWrapper::glBindBuffer(this_00,0x8c2a,this->m_buffer[2]);
    glu::CallLogWrapper::glBufferData(this_00,0x8c2a,0x10,&data,0x88e4);
    lVar4 = 0;
    glu::CallLogWrapper::glBindBuffer(this_00,0x8c2a,0);
    glu::CallLogWrapper::glBindTexture(this_00,0x8c2a,this->m_texture[0]);
    glu::CallLogWrapper::glTexBuffer(this_00,0x8c2a,0x8235,this->m_buffer[2]);
    glu::CallLogWrapper::glBindTexture(this_00,0x8c2a,0);
    this_02 = (pointer *)&data;
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)this_02,10.0);
    tcu::Vector<float,_4>::Vector
              ((Vector<float,_4> *)
               &data.
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,20.0);
    tcu::Vector<float,_4>::Vector(&local_a8,30.0);
    tcu::Vector<float,_4>::Vector(&local_98,40.0);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8c2a,this->m_buffer[3]);
    glu::CallLogWrapper::glBufferData(this_00,0x8c2a,0x40,this_02,0x88e4);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8c2a,0);
    glu::CallLogWrapper::glBindTexture(this_00,0x8c2a,this->m_texture[1]);
    glu::CallLogWrapper::glTexBuffer(this_00,0x8c2a,0x8814,this->m_buffer[3]);
    glu::CallLogWrapper::glBindTexture(this_00,0x8c2a,0);
    glu::CallLogWrapper::glUseProgram(this_00,this->m_program);
    GVar3 = glu::CallLogWrapper::glGetUniformLocation(this_00,this->m_program,"g_path_buffer");
    glu::CallLogWrapper::glUniform1i(this_00,GVar3,0);
    GVar3 = glu::CallLogWrapper::glGetUniformLocation(this_00,this->m_program,"g_input1");
    glu::CallLogWrapper::glUniform1i(this_00,GVar3,1);
    glu::CallLogWrapper::glActiveTexture(this_00,0x84c0);
    glu::CallLogWrapper::glBindTexture(this_00,0x8c2a,this->m_texture[0]);
    glu::CallLogWrapper::glActiveTexture(this_00,0x84c1);
    glu::CallLogWrapper::glBindTexture(this_00,0x8c2a,this->m_texture[1]);
    glu::CallLogWrapper::glDispatchCompute(this_00,1,1,1);
    glu::CallLogWrapper::glMemoryBarrier(this_00,0x200);
    do {
      tcu::Vector<float,_4>::Vector
                ((Vector<float,_4> *)
                 ((long)&data.
                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar4));
      lVar4 = lVar4 + 0x10;
    } while (lVar4 != 0x40);
    glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,*local_80);
    lVar4 = 0;
    glu::CallLogWrapper::glGetBufferSubData(this_00,0x90d2,0,0x40,this_02);
    tcu::Vector<float,_4>::Vector(this_01,3.0);
    tcu::Vector<float,_4>::Vector(expected + 1,20.0);
    tcu::Vector<float,_4>::Vector(expected + 2,-100.0);
    tcu::Vector<float,_4>::Vector(expected + 3,400.0);
    for (uVar5 = 0; uVar5 != 4; uVar5 = uVar5 + 1) {
      tcu::Vector<float,_4>::Vector(&local_d8,(Vector<float,_4> *)this_02);
      tcu::Vector<float,_4>::Vector(&local_e8,this_01);
      if (((((local_d8.m_data[0] != local_e8.m_data[0]) ||
            (NAN(local_d8.m_data[0]) || NAN(local_e8.m_data[0]))) ||
           (local_d8.m_data[1] != local_e8.m_data[1])) ||
          ((NAN(local_d8.m_data[1]) || NAN(local_e8.m_data[1]) ||
           (local_d8.m_data[2] != local_e8.m_data[2])))) ||
         ((NAN(local_d8.m_data[2]) || NAN(local_e8.m_data[2]) ||
          ((local_d8.m_data[3] != local_e8.m_data[3] ||
           (NAN(local_d8.m_data[3]) || NAN(local_e8.m_data[3]))))))) {
        anon_unknown_0::Output("Invalid data at index %d.\n",uVar5 & 0xffffffff);
        return -(ulong)(uVar5 < 4);
      }
      this_01 = this_01 + 1;
      this_02 = this_02 + 2;
    }
  }
  else {
    lVar4 = -1;
  }
  return lVar4;
}

Assistant:

virtual long Run()
	{
		const char* const glsl_cs =
			NL "layout(local_size_x = 4) in;" NL "layout(std140, binding = 0) buffer Output {" NL
			   "  vec4 g_output[4];" NL "};" NL "uniform isamplerBuffer g_path_buffer;" NL
			   "uniform vec4[4] g_input0 = vec4[4](vec4(100), vec4(200), vec4(300), vec4(400));" NL
			   "uniform samplerBuffer g_input1;" NL "layout(binding = 1, std430) buffer Input2 {" NL
			   "  vec4[4] g_input2;" NL "};" NL NL "void Path2(int id) {" NL
			   "  g_output[id] = texelFetch(g_input1, int(gl_LocalInvocationIndex));" NL "}" NL "void main() {" NL
			   "  const int id = int(gl_GlobalInvocationID.x);" NL
			   "  const int path = texelFetch(g_path_buffer, id).x;" NL NL "  if (path == 0) {" NL
			   "    g_output[id] = g_input0[gl_LocalInvocationID.x];" NL "    memoryBarrier();" NL
			   "  } else if (path == 1) {" NL "    return;" NL "  } else if (path == 2) {" NL "    Path2(id);" NL
			   "    return;" NL "  } else if (path == 3) {" NL "    g_output[id] = g_input2[path - 1];" NL
			   "    memoryBarrierBuffer();" NL "  }" NL "}";
		m_program = CreateComputeProgram(glsl_cs);
		glLinkProgram(m_program);
		if (!CheckProgram(m_program))
			return ERROR;

		glGenBuffers(4, m_buffer);
		glGenTextures(2, m_texture);

		/* init 'output' buffer */
		{
			std::vector<vec4> data(4, vec4(-100.0f));
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_buffer[0]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, (GLsizeiptr)(sizeof(vec4) * data.size()), &data[0][0],
						 GL_DYNAMIC_COPY);
		}
		/* init 'input2' buffer */
		{
			const vec4 data[4] = { vec4(1.0f), vec4(2.0f), vec4(3.0f), vec4(4.0f) };
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 1, m_buffer[1]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(data), &data[0][0], GL_DYNAMIC_COPY);
		}
		/* init 'path' buffer */
		{
			const int data[4] = { 3, 2, 1, 0 };
			glBindBuffer(GL_TEXTURE_BUFFER, m_buffer[2]);
			glBufferData(GL_TEXTURE_BUFFER, sizeof(data), &data[0], GL_STATIC_DRAW);
			glBindBuffer(GL_TEXTURE_BUFFER, 0);
			glBindTexture(GL_TEXTURE_BUFFER, m_texture[0]);
			glTexBuffer(GL_TEXTURE_BUFFER, GL_R32I, m_buffer[2]);
			glBindTexture(GL_TEXTURE_BUFFER, 0);
		}
		/* init 'input1' buffer */
		{
			const vec4 data[4] = { vec4(10.0f), vec4(20.0f), vec4(30.0f), vec4(40.0f) };
			glBindBuffer(GL_TEXTURE_BUFFER, m_buffer[3]);
			glBufferData(GL_TEXTURE_BUFFER, sizeof(data), &data[0], GL_STATIC_DRAW);
			glBindBuffer(GL_TEXTURE_BUFFER, 0);
			glBindTexture(GL_TEXTURE_BUFFER, m_texture[1]);
			glTexBuffer(GL_TEXTURE_BUFFER, GL_RGBA32F, m_buffer[3]);
			glBindTexture(GL_TEXTURE_BUFFER, 0);
		}

		glUseProgram(m_program);
		glUniform1i(glGetUniformLocation(m_program, "g_path_buffer"), 0);
		glUniform1i(glGetUniformLocation(m_program, "g_input1"), 1);
		glActiveTexture(GL_TEXTURE0);
		glBindTexture(GL_TEXTURE_BUFFER, m_texture[0]);
		glActiveTexture(GL_TEXTURE1);
		glBindTexture(GL_TEXTURE_BUFFER, m_texture[1]);
		glDispatchCompute(1, 1, 1);
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);

		/* validate 'output' buffer */
		{
			vec4 data[4];
			glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_buffer[0]);
			glGetBufferSubData(GL_SHADER_STORAGE_BUFFER, 0, sizeof(data), &data[0][0]);

			const vec4 expected[4] = { vec4(3.0f), vec4(20.0f), vec4(-100.0f), vec4(400.0f) };
			for (int i = 0; i < 4; ++i)
			{
				if (!IsEqual(data[i], expected[i]))
				{
					Output("Invalid data at index %d.\n", i);
					return ERROR;
				}
			}
		}
		return NO_ERROR;
	}